

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::edit_distance::anon_unknown_1::Hunk::~Hunk(Hunk *this)

{
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::~list((list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *)
          0x13bd1c);
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::~list((list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *)
          0x13bd2a);
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::~list((list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *)
          0x13bd38);
  return;
}

Assistant:

Hunk(size_t left_start, size_t right_start)
      : left_start_(left_start),
        right_start_(right_start),
        adds_(),
        removes_(),
        common_() {}